

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O2

void __thiscall
Clasp::ShortImplicationsGraph::Block::addUnlock(Block *this,uint32 lockedSize,Literal *x,uint32 xs)

{
  if (xs != 0) {
    memmove(this->data + lockedSize,x,(ulong)xs << 2);
  }
  LOCK();
  (this->size_lock).super___atomic_base<unsigned_int>._M_i = (xs + lockedSize) * 2;
  UNLOCK();
  return;
}

Assistant:

void ShortImplicationsGraph::Block::addUnlock(uint32 lockedSize, const Literal* x, uint32 xs) {
	std::copy(x, x+xs, data+lockedSize);
	size_lock = ((lockedSize+xs) << 1);
}